

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseEncodingSynapse.cpp
# Opt level: O3

void __thiscall TemporalPhaseEncodingSynapse::update(TemporalPhaseEncodingSynapse *this)

{
  int iVar1;
  Population *pPVar2;
  TemporalPhaseEncodingSynapse_param *pTVar3;
  long lVar4;
  double *pdVar5;
  pointer ppEVar6;
  Event *pEVar7;
  Clock *pCVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (0 < this->inputSize) {
    iVar9 = 0;
    do {
      resetOutput(this);
      if (0 < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows) {
        uVar11 = 0;
        do {
          dVar13 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[uVar11];
          dVar12 = Clock::getCurrentTime(this->clock);
          if (dVar12 < dVar13) {
LAB_00109bfe:
            pEVar7 = (Event *)operator_new(0x18);
            pEVar7->_vptr_Event = (_func_int **)&PTR_setWeight_00110ac0;
            pEVar7->type = No;
            pCVar8 = Clock::getInstance();
            dVar13 = Clock::getCurrentTime(pCVar8);
            pEVar7->eventTime = dVar13;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] = pEVar7;
          }
          else {
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar11) {
LAB_00109d9b:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x1a9,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[uVar11] <= -1.0) goto LAB_00109bfe;
            pEVar7 = (Event *)operator_new(0x28);
            pEVar7->_vptr_Event = (_func_int **)&PTR_setWeight_00110a70;
            *(undefined4 *)&pEVar7[1]._vptr_Event = 1;
            *(undefined8 *)&pEVar7[1].type = 0x3ff0000000000000;
            pEVar7->type = Spike;
            pCVar8 = Clock::getInstance();
            dVar13 = Clock::getCurrentTime(pCVar8);
            pEVar7->eventTime = dVar13;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] = pEVar7;
            (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11]->_vptr_Event)(0x4094500000000000);
            if ((this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar11) goto LAB_00109d9b;
            (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data[uVar11] = -1.0;
          }
          pPVar2 = (this->super_Synapse).to_population;
          (*pPVar2->_vptr_Population[5])
                    (pPVar2,uVar11 & 0xffffffff,
                     (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11]);
          Logging::logEvent(this->logger,(long)this,(int)uVar11,
                            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar11]->type);
          uVar11 = uVar11 + 1;
        } while ((long)uVar11 <
                 (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows);
      }
      dVar13 = this->currentWindow;
      dVar12 = Clock::getCurrentTime(this->clock);
      if (dVar13 <= dVar12) {
        pTVar3 = this->param;
        lVar4 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if (0 < lVar4) {
          pdVar5 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          ppEVar6 = (((this->super_Synapse).from_population)->output).
                    super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar1 = pTVar3->som_frequency;
          lVar10 = 0;
          do {
            dVar13 = pTVar3->window_length_s;
            dVar12 = round(((double)ppEVar6[lVar10][1]._vptr_Event * 0.8 + 0.1) * dVar13 *
                           (double)iVar1);
            dVar14 = dVar12 / (double)iVar1 + this->phaseOffset;
            dVar12 = dVar13 * 0.9;
            if (dVar14 <= dVar13 * 0.9) {
              dVar12 = dVar14;
            }
            uVar11 = -(ulong)(dVar14 < dVar13 * 0.0);
            pdVar5[lVar10] =
                 (double)(~uVar11 & (ulong)dVar12 | (ulong)(dVar13 * 0.0) & uVar11) +
                 this->currentWindow;
            lVar10 = lVar10 + 1;
          } while (lVar4 != lVar10);
        }
        this->currentWindow = pTVar3->window_length_s + this->currentWindow;
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->inputSize);
  }
  return;
}

Assistant:

void TemporalPhaseEncodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        resetOutput();
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) <= clock->getCurrentTime() && spikeTimes(j) > -1) {
                output[j] = new SpikeEvent();
                output[j]->setWeight(1300.0);
                spikeTimes(j) = -1;
            }
            else {
                output[j] = new NoEvent();
            }
            to_population->setInput(j, output[j]);
            logger->logEvent((long)this, j, output[j]->type);
        }
        if(currentWindow <= clock->getCurrentTime()) {
            for(int j = 0; j < spikeTimes.size(); j++) {
                double scaledValue = 0.1 + static_cast<ValueEvent*>(from_population->output[j])->value * 0.8;
                double vs = scaledValue * param->window_length_s;
                double bin = round(vs * param->som_frequency);
                spikeTimes(j) = currentWindow + helperFunctions::clamp(bin / param->som_frequency + phaseOffset, 0*param->window_length_s, param->window_length_s*0.9);

                // double spikeTime = floor(static_cast<ValueEvent*>(from_population->output[j])->value * param->som_frequency) * phaseStep +param->som_phase;
                // spikeTimes(j) = currentWindow + helperFunctions::clamp((spikeTime * 0.8), 0, 0.9*param->window_length_s);
            }
            currentWindow += param->window_length_s;
        }
    }
}